

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::
     RenderLineSegments<ImPlot::GetterXRefYs<double>,ImPlot::GetterXRefYs<double>,ImPlot::TransformerLogLin>
               (GetterXRefYs<double> *getter1,GetterXRefYs<double> *getter2,
               TransformerLogLin *transformer,ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  ImPlotPlot *pIVar6;
  double dVar7;
  ImPlotContext *pIVar8;
  ImPlotContext *pIVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_78;
  int local_6c;
  ImDrawList *local_68;
  ImPlotContext *local_60;
  undefined1 local_58 [8];
  GetterXRefYs<double> *local_50;
  TransformerLogLin *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  local_68 = DrawList;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterXRefYs<double>,ImPlot::GetterXRefYs<double>,ImPlot::TransformerLogLin>>
              ((LineSegmentsRenderer<ImPlot::GetterXRefYs<double>,_ImPlot::GetterXRefYs<double>,_ImPlot::TransformerLogLin>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    local_60 = GImPlot;
    local_6c = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_6c = getter1->Count;
    }
    if (0 < local_6c) {
      iVar10 = 0;
      do {
        pIVar8 = GImPlot;
        iVar5 = getter1->Count;
        dVar3 = *(double *)
                 ((long)getter1->Ys +
                 (long)(((getter1->Offset + iVar10) % iVar5 + iVar5) % iVar5) *
                 (long)getter1->Stride);
        dVar7 = log10(getter1->XRef / (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar9 = GImPlot;
        pIVar6 = pIVar8->CurrentPlot;
        dVar4 = (pIVar6->XAxis).Range.Min;
        iVar5 = transformer->YAxis;
        local_58._4_4_ =
             (float)((dVar3 - pIVar6->YAxis[iVar5].Range.Min) * pIVar8->My[iVar5] +
                    (double)pIVar8->PixelRange[iVar5].Min.y);
        local_58._0_4_ =
             (float)((((double)(float)(dVar7 / pIVar8->LogDenX) *
                       ((pIVar6->XAxis).Range.Max - dVar4) + dVar4) - dVar4) * pIVar8->Mx +
                    (double)pIVar8->PixelRange[iVar5].Min.x);
        iVar5 = getter2->Count;
        dVar3 = *(double *)
                 ((long)getter2->Ys +
                 (long)(((getter2->Offset + iVar10) % iVar5 + iVar5) % iVar5) *
                 (long)getter2->Stride);
        dVar7 = log10(getter2->XRef / (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar6 = pIVar9->CurrentPlot;
        dVar4 = (pIVar6->XAxis).Range.Min;
        iVar5 = transformer->YAxis;
        fVar11 = (float)((((double)(float)(dVar7 / pIVar9->LogDenX) *
                           ((pIVar6->XAxis).Range.Max - dVar4) + dVar4) - dVar4) * pIVar9->Mx +
                        (double)pIVar9->PixelRange[iVar5].Min.x);
        fVar12 = (float)((dVar3 - pIVar6->YAxis[iVar5].Range.Min) * pIVar9->My[iVar5] +
                        (double)pIVar9->PixelRange[iVar5].Min.y);
        local_78.y = fVar12;
        local_78.x = fVar11;
        pIVar6 = local_60->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (fVar12 <= (float)local_58._4_4_) {
          fVar2 = fVar12;
        }
        if ((fVar2 < (pIVar6->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(fVar12 <= (float)local_58._4_4_) & (uint)fVar12 |
                           local_58._4_4_ & -(uint)(fVar12 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar6->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (fVar11 <= (float)local_58._0_4_) {
            fVar2 = fVar11;
          }
          if ((fVar2 < (pIVar6->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(fVar11 <= (float)local_58._0_4_) & (uint)fVar11 |
                             local_58._0_4_ & -(uint)(fVar11 <= (float)local_58._0_4_)),
             (pIVar6->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar6->PlotRect).Min.x)) {
            ImDrawList::AddLine(local_68,(ImVec2 *)local_58,&local_78,col,line_weight);
          }
        }
        iVar10 = iVar10 + 1;
      } while (local_6c != iVar10);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}